

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkWsiUtil.cpp
# Opt level: O1

vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *
vk::wsi::getPhysicalDeviceSurfaceFormats
          (vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
           *__return_storage_ptr__,InstanceInterface *vki,VkPhysicalDevice physicalDevice,
          VkSurfaceKHR surface)

{
  VkResult VVar1;
  vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_> *formats;
  deUint32 numFormats;
  allocator_type local_2d;
  uint local_2c;
  
  local_2c = 0;
  VVar1 = (*vki->_vptr_InstanceInterface[0x10])(vki,physicalDevice,surface.m_internal,&local_2c,0);
  checkResult(VVar1,
              "vki.getPhysicalDeviceSurfaceFormatsKHR(physicalDevice, surface, &numFormats, DE_NULL)"
              ,
              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkWsiUtil.cpp"
              ,0x117);
  if ((ulong)local_2c == 0) {
    (__return_storage_ptr__->
    super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    std::vector<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>::vector
              (__return_storage_ptr__,(ulong)local_2c,&local_2d);
    VVar1 = (*vki->_vptr_InstanceInterface[0x10])
                      (vki,physicalDevice,surface.m_internal,&local_2c,
                       (__return_storage_ptr__->
                       super__Vector_base<vk::VkSurfaceFormatKHR,_std::allocator<vk::VkSurfaceFormatKHR>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    checkResult(VVar1,
                "vki.getPhysicalDeviceSurfaceFormatsKHR(physicalDevice, surface, &numFormats, &formats[0])"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkWsiUtil.cpp"
                ,0x11d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VkSurfaceFormatKHR> getPhysicalDeviceSurfaceFormats (const InstanceInterface&		vki,
																 VkPhysicalDevice				physicalDevice,
																 VkSurfaceKHR					surface)
{
	deUint32	numFormats	= 0;

	VK_CHECK(vki.getPhysicalDeviceSurfaceFormatsKHR(physicalDevice, surface, &numFormats, DE_NULL));

	if (numFormats > 0)
	{
		std::vector<VkSurfaceFormatKHR>	formats	(numFormats);

		VK_CHECK(vki.getPhysicalDeviceSurfaceFormatsKHR(physicalDevice, surface, &numFormats, &formats[0]));

		return formats;
	}
	else
		return std::vector<VkSurfaceFormatKHR>();
}